

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

void __thiscall cinatra::http_parser::http_parser(http_parser *this)

{
  this->status_ = 0;
  (this->msg_)._M_len = 0;
  (this->msg_)._M_str = (char *)0x0;
  *(undefined8 *)((long)&(this->msg_)._M_str + 4) = 0;
  *(undefined8 *)((long)&this->num_headers_ + 4) = 0;
  this->body_len_ = 0;
  *(undefined4 *)((long)&this->body_len_ + 7) = 0;
  memset(&this->headers_,0,0xcb0);
  (this->queries_)._M_h._M_buckets = &(this->queries_)._M_h._M_single_bucket;
  (this->queries_)._M_h._M_bucket_count = 1;
  (this->queries_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->queries_)._M_h._M_element_count = 0;
  (this->queries_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->queries_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->queries_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

void parse_body_len() {
    auto header_value = this->get_header_value("content-length"sv);
    if (header_value.empty()) {
      body_len_ = 0;
    }
    else {
      auto [ptr, ec] = std::from_chars(
          header_value.data(), header_value.data() + header_value.size(),
          body_len_, 10);
      if (ec != std::errc{}) {
        body_len_ = -1;
      }
    }
  }